

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeIntegrity(sqlite3_vtab *pVtab,char *zSchema,char *zName,int isQuick,char **pzErr)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = rtreeCheckTable((sqlite3 *)pVtab[1].pModule,(char *)pVtab[2].pModule,
                          *(char **)&pVtab[2].nRef,pzErr);
  if (iVar1 == 0) {
    if (*pzErr == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      pcVar2 = sqlite3_mprintf("In RTree %s.%s:\n%z",pVtab[2].pModule,*(undefined8 *)&pVtab[2].nRef)
      ;
      *pzErr = pcVar2;
      iVar1 = 7;
      if (pcVar2 != (char *)0x0) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int rtreeIntegrity(
  sqlite3_vtab *pVtab,   /* The virtual table to check */
  const char *zSchema,   /* Schema in which the virtual table lives */
  const char *zName,     /* Name of the virtual table */
  int isQuick,           /* True for a quick_check */
  char **pzErr           /* Write results here */
){
  Rtree *pRtree = (Rtree*)pVtab;
  int rc;
  assert( pzErr!=0 && *pzErr==0 );
  UNUSED_PARAMETER(zSchema);
  UNUSED_PARAMETER(zName);
  UNUSED_PARAMETER(isQuick);
  rc = rtreeCheckTable(pRtree->db, pRtree->zDb, pRtree->zName, pzErr);
  if( rc==SQLITE_OK && *pzErr ){
    *pzErr = sqlite3_mprintf("In RTree %s.%s:\n%z",
                 pRtree->zDb, pRtree->zName, *pzErr);
    if( (*pzErr)==0 ) rc = SQLITE_NOMEM;
  }
  return rc;
}